

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::avx512::
     BVHNIntersector1<8,_16777232,_true,_embree::avx512::SubGridMBIntersector1Pluecker<8,_true>_>::
     occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  ushort uVar10;
  ushort uVar11;
  uint uVar12;
  bool bVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [16];
  int iVar32;
  AABBNodeMB4D *node1;
  ulong uVar33;
  long lVar34;
  ulong uVar35;
  Geometry *pGVar36;
  Scene *pSVar37;
  Ray *pRVar38;
  long lVar39;
  long lVar40;
  long lVar41;
  ulong uVar42;
  long lVar43;
  long lVar44;
  long lVar45;
  long lVar46;
  long lVar47;
  RTCIntersectArguments *pRVar48;
  ulong unaff_R12;
  size_t mask;
  long lVar49;
  long lVar50;
  ulong uVar51;
  bool bVar52;
  byte bVar53;
  float fVar54;
  float fVar86;
  float fVar87;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar92 [16];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [16];
  undefined1 auVar96 [32];
  undefined4 uVar97;
  undefined1 auVar98 [16];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [16];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [16];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [64];
  float fVar116;
  undefined1 auVar115 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [64];
  undefined1 auVar119 [32];
  undefined1 auVar120 [64];
  undefined1 auVar121 [32];
  undefined1 auVar122 [64];
  undefined1 auVar123 [64];
  undefined1 in_ZMM26 [64];
  undefined1 auVar124 [64];
  undefined1 auVar125 [64];
  undefined1 auVar126 [64];
  undefined1 auVar127 [64];
  undefined1 auVar128 [64];
  undefined1 auVar129 [64];
  UVIdentity<8> mapUV;
  Scene *scene;
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  PlueckerHitM<8,_embree::avx512::UVIdentity<8>_> hit;
  NodeRef stack [564];
  undefined1 local_15d1;
  ulong *local_15d0;
  float local_15c4;
  ulong local_15c0;
  ulong local_15b8;
  RTCRayQueryContext *local_15b0;
  ulong local_15a8;
  RTCIntersectArguments *local_15a0;
  Geometry *local_1598;
  long local_1590;
  long local_1588;
  long local_1580;
  long local_1578;
  long local_1570;
  RayQueryContext *local_1568;
  Scene *local_1560;
  uint local_1554;
  uint local_1550;
  int local_154c;
  ulong local_1548;
  ulong local_1540;
  long local_1538;
  ulong local_1530;
  long local_1528;
  Ray *local_1520;
  ulong local_1518;
  ulong local_1510;
  long local_1508;
  float local_1500;
  float local_14fc;
  float local_14f8;
  undefined4 local_14f4;
  undefined4 local_14f0;
  undefined4 local_14ec;
  undefined4 local_14e8;
  uint local_14e4;
  uint local_14e0;
  RTCFilterFunctionNArguments local_14d0;
  undefined1 local_14a0 [32];
  undefined1 local_1480 [32];
  undefined1 local_1460 [32];
  undefined1 local_1440 [32];
  undefined1 local_1420 [32];
  undefined1 local_1400 [32];
  undefined1 local_13e0 [32];
  undefined1 local_13c0 [32];
  undefined1 local_13a0 [32];
  float local_1380;
  float fStack_137c;
  float fStack_1378;
  float fStack_1374;
  float fStack_1370;
  float fStack_136c;
  float fStack_1368;
  float fStack_1364;
  undefined1 local_1360 [32];
  float local_1340;
  float fStack_133c;
  float fStack_1338;
  float fStack_1334;
  float fStack_1330;
  float fStack_132c;
  float fStack_1328;
  float fStack_1324;
  float local_1320;
  float fStack_131c;
  float fStack_1318;
  float fStack_1314;
  float fStack_1310;
  float fStack_130c;
  float fStack_1308;
  float fStack_1304;
  undefined1 local_1300 [32];
  undefined1 *local_12e0;
  byte local_12d8;
  undefined1 local_12c0 [32];
  undefined1 local_12a0 [32];
  undefined1 local_1280 [32];
  float local_1260 [4];
  float fStack_1250;
  float fStack_124c;
  float fStack_1248;
  uint uStack_1244;
  float local_1240 [4];
  float fStack_1230;
  float fStack_122c;
  float fStack_1228;
  uint uStack_1224;
  float local_1220 [4];
  float fStack_1210;
  float fStack_120c;
  float fStack_1208;
  uint uStack_1204;
  ulong local_1200 [570];
  
  uVar51 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (uVar51 != 8) {
    vxorps_avx512vl(in_ZMM26._0_16_,in_ZMM26._0_16_);
    auVar60 = vucomiss_avx512f(ZEXT416((uint)ray->tfar));
    auVar124 = ZEXT1664(auVar60);
    if (uVar51 < 9) {
      local_15d0 = local_1200 + 1;
      aVar1 = (ray->dir).field_0;
      auVar55 = vmaxss_avx512f(auVar60,ZEXT416((uint)(ray->org).field_0.m128[3]));
      auVar56._8_4_ = 0x7fffffff;
      auVar56._0_8_ = 0x7fffffff7fffffff;
      auVar56._12_4_ = 0x7fffffff;
      auVar56 = vandps_avx512vl((undefined1  [16])aVar1,auVar56);
      auVar57._8_4_ = 0x219392ef;
      auVar57._0_8_ = 0x219392ef219392ef;
      auVar57._12_4_ = 0x219392ef;
      uVar51 = vcmpps_avx512vl(auVar56,auVar57,1);
      auVar101._8_4_ = 0x3f800000;
      auVar101._0_8_ = &DAT_3f8000003f800000;
      auVar101._12_4_ = 0x3f800000;
      auVar56 = vdivps_avx(auVar101,(undefined1  [16])aVar1);
      auVar57 = vbroadcastss_avx512vl(ZEXT416(0x5d5e0b6b));
      bVar52 = (bool)((byte)uVar51 & 1);
      auVar59._0_4_ = (uint)bVar52 * auVar57._0_4_ | (uint)!bVar52 * auVar56._0_4_;
      bVar52 = (bool)((byte)(uVar51 >> 1) & 1);
      auVar59._4_4_ = (uint)bVar52 * auVar57._4_4_ | (uint)!bVar52 * auVar56._4_4_;
      bVar52 = (bool)((byte)(uVar51 >> 2) & 1);
      auVar59._8_4_ = (uint)bVar52 * auVar57._8_4_ | (uint)!bVar52 * auVar56._8_4_;
      bVar52 = (bool)((byte)(uVar51 >> 3) & 1);
      auVar59._12_4_ = (uint)bVar52 * auVar57._12_4_ | (uint)!bVar52 * auVar56._12_4_;
      auVar58._8_4_ = 0x3f7ffffa;
      auVar58._0_8_ = 0x3f7ffffa3f7ffffa;
      auVar58._12_4_ = 0x3f7ffffa;
      vmulps_avx512vl(auVar59,auVar58);
      auVar17._8_4_ = 0x3f800003;
      auVar17._0_8_ = 0x3f8000033f800003;
      auVar17._12_4_ = 0x3f800003;
      auVar58 = vmulps_avx512vl(auVar59,auVar17);
      auVar61 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->org).field_0.m128[0]));
      auVar125 = ZEXT3264(auVar61);
      local_1200[0] = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
      auVar61 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->org).field_0.m128[1]));
      auVar126 = ZEXT3264(auVar61);
      auVar61 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->org).field_0.m128[2]));
      auVar127 = ZEXT3264(auVar61);
      auVar57 = vucomiss_avx512f(auVar60);
      auVar61 = vbroadcastss_avx512vl(auVar57);
      auVar128 = ZEXT3264(auVar61);
      auVar56 = vmovshdup_avx(auVar57);
      auVar61 = vbroadcastsd_avx512vl(auVar56);
      auVar129 = ZEXT3264(auVar61);
      vshufpd_avx(auVar57,auVar57,1);
      auVar62._8_4_ = 2;
      auVar62._0_8_ = 0x200000002;
      auVar62._12_4_ = 2;
      auVar62._16_4_ = 2;
      auVar62._20_4_ = 2;
      auVar62._24_4_ = 2;
      auVar62._28_4_ = 2;
      local_1360 = vpermps_avx2(auVar62,ZEXT1632(auVar57));
      auVar114 = ZEXT3264(local_1360);
      fVar90 = auVar58._0_4_;
      auVar61._8_4_ = 1;
      auVar61._0_8_ = 0x100000001;
      auVar61._12_4_ = 1;
      auVar61._16_4_ = 1;
      auVar61._20_4_ = 1;
      auVar61._24_4_ = 1;
      auVar61._28_4_ = 1;
      local_13a0 = vpermps_avx2(auVar61,ZEXT1632(auVar58));
      auVar118 = ZEXT3264(local_13a0);
      local_13c0 = vpermps_avx2(auVar62,ZEXT1632(auVar58));
      auVar120 = ZEXT3264(local_13c0);
      lVar49 = 0;
      vucomiss_avx512f(auVar60);
      lVar40 = 0x40;
      vucomiss_avx512f(auVar60);
      lVar41 = 0x80;
      lVar43 = 0x20;
      lVar45 = 0x60;
      lVar46 = 0xa0;
      uVar97 = auVar55._0_4_;
      local_13e0._4_4_ = uVar97;
      local_13e0._0_4_ = uVar97;
      local_13e0._8_4_ = uVar97;
      local_13e0._12_4_ = uVar97;
      local_13e0._16_4_ = uVar97;
      local_13e0._20_4_ = uVar97;
      local_13e0._24_4_ = uVar97;
      local_13e0._28_4_ = uVar97;
      auVar122 = ZEXT3264(local_13e0);
      local_1400 = vbroadcastss_avx512vl(ZEXT416((uint)ray->tfar));
      auVar123 = ZEXT3264(local_1400);
      local_1520 = ray;
      local_1528 = 0;
      local_1380 = fVar90;
      fStack_137c = fVar90;
      fStack_1378 = fVar90;
      fStack_1374 = fVar90;
      fStack_1370 = fVar90;
      fStack_136c = fVar90;
      fStack_1368 = fVar90;
      fStack_1364 = fVar90;
      local_1570 = 0x40;
      local_1578 = 0x80;
      local_1580 = 0x20;
      local_1588 = 0x60;
      local_1590 = 0xa0;
      fVar116 = fVar90;
      fVar54 = fVar90;
      fVar86 = fVar90;
      fVar87 = fVar90;
      fVar88 = fVar90;
      fVar89 = fVar90;
      local_1568 = context;
      do {
        if (local_15d0 == local_1200) {
          return;
        }
        uVar51 = local_15d0[-1];
        local_15d0 = local_15d0 + -1;
        do {
          if ((uVar51 & 8) == 0) {
            uVar33 = uVar51 & 0xfffffffffffffff0;
            uVar97 = *(undefined4 *)((long)&(ray->dir).field_0 + 0xc);
            auVar67._4_4_ = uVar97;
            auVar67._0_4_ = uVar97;
            auVar67._8_4_ = uVar97;
            auVar67._12_4_ = uVar97;
            auVar67._16_4_ = uVar97;
            auVar67._20_4_ = uVar97;
            auVar67._24_4_ = uVar97;
            auVar67._28_4_ = uVar97;
            auVar60 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar33 + 0x100 + lVar49),auVar67,
                                      *(undefined1 (*) [32])(uVar33 + 0x40 + lVar49));
            auVar61 = vsubps_avx512vl(ZEXT1632(auVar60),auVar125._0_32_);
            auVar62 = vmulps_avx512vl(auVar128._0_32_,auVar61);
            auVar60 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar33 + 0x100 + lVar40),auVar67,
                                      *(undefined1 (*) [32])(uVar33 + 0x40 + lVar40));
            auVar61 = vsubps_avx512vl(ZEXT1632(auVar60),auVar126._0_32_);
            auVar61 = vmulps_avx512vl(auVar129._0_32_,auVar61);
            auVar60 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar33 + 0x100 + lVar41),auVar67,
                                      *(undefined1 (*) [32])(uVar33 + 0x40 + lVar41));
            auVar63 = vsubps_avx512vl(ZEXT1632(auVar60),auVar127._0_32_);
            auVar64._4_4_ = auVar114._4_4_ * auVar63._4_4_;
            auVar64._0_4_ = auVar114._0_4_ * auVar63._0_4_;
            auVar64._8_4_ = auVar114._8_4_ * auVar63._8_4_;
            auVar64._12_4_ = auVar114._12_4_ * auVar63._12_4_;
            auVar64._16_4_ = auVar114._16_4_ * auVar63._16_4_;
            auVar64._20_4_ = auVar114._20_4_ * auVar63._20_4_;
            auVar64._24_4_ = auVar114._24_4_ * auVar63._24_4_;
            auVar64._28_4_ = auVar63._28_4_;
            auVar61 = vmaxps_avx(auVar61,auVar64);
            auVar62 = vmaxps_avx(auVar122._0_32_,auVar62);
            auVar61 = vmaxps_avx(auVar62,auVar61);
            auVar60 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar33 + 0x100 + lVar43),auVar67,
                                      *(undefined1 (*) [32])(uVar33 + 0x40 + lVar43));
            auVar62 = vsubps_avx512vl(ZEXT1632(auVar60),auVar125._0_32_);
            auVar63._4_4_ = fVar116 * auVar62._4_4_;
            auVar63._0_4_ = fVar90 * auVar62._0_4_;
            auVar63._8_4_ = fVar54 * auVar62._8_4_;
            auVar63._12_4_ = fVar86 * auVar62._12_4_;
            auVar63._16_4_ = fVar87 * auVar62._16_4_;
            auVar63._20_4_ = fVar88 * auVar62._20_4_;
            auVar63._24_4_ = fVar89 * auVar62._24_4_;
            auVar63._28_4_ = auVar62._28_4_;
            auVar60 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar33 + 0x100 + lVar45),auVar67,
                                      *(undefined1 (*) [32])(uVar33 + 0x40 + lVar45));
            auVar62 = vsubps_avx512vl(ZEXT1632(auVar60),auVar126._0_32_);
            auVar65._4_4_ = auVar118._4_4_ * auVar62._4_4_;
            auVar65._0_4_ = auVar118._0_4_ * auVar62._0_4_;
            auVar65._8_4_ = auVar118._8_4_ * auVar62._8_4_;
            auVar65._12_4_ = auVar118._12_4_ * auVar62._12_4_;
            auVar65._16_4_ = auVar118._16_4_ * auVar62._16_4_;
            auVar65._20_4_ = auVar118._20_4_ * auVar62._20_4_;
            auVar65._24_4_ = auVar118._24_4_ * auVar62._24_4_;
            auVar65._28_4_ = auVar62._28_4_;
            auVar60 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar33 + 0x100 + lVar46),auVar67,
                                      *(undefined1 (*) [32])(uVar33 + 0x40 + lVar46));
            auVar62 = vsubps_avx512vl(ZEXT1632(auVar60),auVar127._0_32_);
            auVar66._4_4_ = auVar120._4_4_ * auVar62._4_4_;
            auVar66._0_4_ = auVar120._0_4_ * auVar62._0_4_;
            auVar66._8_4_ = auVar120._8_4_ * auVar62._8_4_;
            auVar66._12_4_ = auVar120._12_4_ * auVar62._12_4_;
            auVar66._16_4_ = auVar120._16_4_ * auVar62._16_4_;
            auVar66._20_4_ = auVar120._20_4_ * auVar62._20_4_;
            auVar66._24_4_ = auVar120._24_4_ * auVar62._24_4_;
            auVar66._28_4_ = auVar62._28_4_;
            auVar62 = vminps_avx(auVar65,auVar66);
            auVar64 = vminps_avx512vl(auVar123._0_32_,auVar63);
            auVar62 = vminps_avx(auVar64,auVar62);
            if (((uint)uVar51 & 7) == 6) {
              uVar14 = vcmpps_avx512vl(auVar61,auVar62,2);
              uVar16 = vcmpps_avx512vl(auVar67,*(undefined1 (*) [32])(uVar33 + 0x1c0),0xd);
              uVar15 = vcmpps_avx512vl(auVar67,*(undefined1 (*) [32])(uVar33 + 0x1e0),1);
              bVar53 = (byte)uVar14 & (byte)uVar16 & (byte)uVar15;
            }
            else {
              uVar14 = vcmpps_avx512vl(auVar61,auVar62,2);
              bVar53 = (byte)uVar14;
            }
            unaff_R12 = CONCAT44((int)(unaff_R12 >> 0x20),(uint)bVar53);
          }
          if ((uVar51 & 8) == 0) {
            if (unaff_R12 == 0) {
              iVar32 = 4;
            }
            else {
              uVar33 = uVar51 & 0xfffffffffffffff0;
              lVar47 = 0;
              for (uVar51 = unaff_R12; (uVar51 & 1) == 0; uVar51 = uVar51 >> 1 | 0x8000000000000000)
              {
                lVar47 = lVar47 + 1;
              }
              iVar32 = 0;
              for (uVar35 = unaff_R12 - 1 & unaff_R12; uVar51 = *(ulong *)(uVar33 + lVar47 * 8),
                  uVar35 != 0; uVar35 = uVar35 - 1 & uVar35) {
                *local_15d0 = uVar51;
                local_15d0 = local_15d0 + 1;
                lVar47 = 0;
                for (uVar51 = uVar35; (uVar51 & 1) == 0; uVar51 = uVar51 >> 1 | 0x8000000000000000)
                {
                  lVar47 = lVar47 + 1;
                }
              }
            }
          }
          else {
            iVar32 = 6;
          }
        } while (iVar32 == 0);
        if (iVar32 == 6) {
          local_1530 = (ulong)((uint)uVar51 & 0xf) - 8;
          bVar52 = local_1530 != 0;
          if (bVar52) {
            uVar51 = uVar51 & 0xfffffffffffffff0;
            local_1510 = 0;
            do {
              lVar47 = local_1510 * 0xe0;
              fVar91 = ((ray->dir).field_0.m128[3] - *(float *)(uVar51 + 0xd0 + lVar47)) *
                       *(float *)(uVar51 + 0xd4 + lVar47);
              auVar95._8_8_ = 0;
              auVar95._0_8_ = *(ulong *)(uVar51 + 0x40 + lVar47);
              auVar98._8_8_ = 0;
              auVar98._0_8_ = *(ulong *)(uVar51 + 0x48 + lVar47);
              uVar14 = vpcmpub_avx512vl(auVar95,auVar98,2);
              auVar61 = vpmovzxbd_avx2(auVar95);
              auVar61 = vcvtdq2ps_avx(auVar61);
              uVar97 = *(undefined4 *)(uVar51 + 0x7c + lVar47);
              auVar73._4_4_ = uVar97;
              auVar73._0_4_ = uVar97;
              auVar73._8_4_ = uVar97;
              auVar73._12_4_ = uVar97;
              auVar73._16_4_ = uVar97;
              auVar73._20_4_ = uVar97;
              auVar73._24_4_ = uVar97;
              auVar73._28_4_ = uVar97;
              uVar97 = *(undefined4 *)(uVar51 + 0x70 + lVar47);
              auVar75._4_4_ = uVar97;
              auVar75._0_4_ = uVar97;
              auVar75._8_4_ = uVar97;
              auVar75._12_4_ = uVar97;
              auVar75._16_4_ = uVar97;
              auVar75._20_4_ = uVar97;
              auVar75._24_4_ = uVar97;
              auVar75._28_4_ = uVar97;
              auVar56 = vfmadd213ps_fma(auVar61,auVar73,auVar75);
              auVar60._8_8_ = 0;
              auVar60._0_8_ = *(ulong *)(uVar51 + 0x88 + lVar47);
              auVar61 = vpmovzxbd_avx2(auVar60);
              uVar97 = *(undefined4 *)(uVar51 + 0xc4 + lVar47);
              auVar78._4_4_ = uVar97;
              auVar78._0_4_ = uVar97;
              auVar78._8_4_ = uVar97;
              auVar78._12_4_ = uVar97;
              auVar78._16_4_ = uVar97;
              auVar78._20_4_ = uVar97;
              auVar78._24_4_ = uVar97;
              auVar78._28_4_ = uVar97;
              uVar97 = *(undefined4 *)(uVar51 + 0xb8 + lVar47);
              auVar79._4_4_ = uVar97;
              auVar79._0_4_ = uVar97;
              auVar79._8_4_ = uVar97;
              auVar79._12_4_ = uVar97;
              auVar79._16_4_ = uVar97;
              auVar79._20_4_ = uVar97;
              auVar79._24_4_ = uVar97;
              auVar79._28_4_ = uVar97;
              auVar61 = vcvtdq2ps_avx(auVar61);
              auVar60 = vfmadd213ps_fma(auVar61,auVar78,auVar79);
              auVar72._4_4_ = fVar91;
              auVar72._0_4_ = fVar91;
              auVar72._8_4_ = fVar91;
              auVar72._12_4_ = fVar91;
              auVar72._16_4_ = fVar91;
              auVar72._20_4_ = fVar91;
              auVar72._24_4_ = fVar91;
              auVar72._28_4_ = fVar91;
              auVar61 = vsubps_avx(ZEXT1632(auVar60),ZEXT1632(auVar56));
              auVar60 = vfmadd213ps_fma(auVar61,auVar72,ZEXT1632(auVar56));
              auVar61 = vpmovzxbd_avx2(auVar98);
              auVar61 = vcvtdq2ps_avx(auVar61);
              auVar56 = vfmadd213ps_fma(auVar61,auVar73,auVar75);
              auVar55._8_8_ = 0;
              auVar55._0_8_ = *(ulong *)(uVar51 + 0x90 + lVar47);
              auVar61 = vpmovzxbd_avx2(auVar55);
              auVar61 = vcvtdq2ps_avx(auVar61);
              auVar57 = vfmadd213ps_fma(auVar61,auVar78,auVar79);
              auVar61 = vsubps_avx(ZEXT1632(auVar57),ZEXT1632(auVar56));
              auVar56 = vfmadd213ps_fma(auVar61,auVar72,ZEXT1632(auVar56));
              auVar2._8_8_ = 0;
              auVar2._0_8_ = *(ulong *)(uVar51 + 0x50 + lVar47);
              auVar61 = vpmovzxbd_avx2(auVar2);
              uVar97 = *(undefined4 *)(uVar51 + 0x80 + lVar47);
              auVar74._4_4_ = uVar97;
              auVar74._0_4_ = uVar97;
              auVar74._8_4_ = uVar97;
              auVar74._12_4_ = uVar97;
              auVar74._16_4_ = uVar97;
              auVar74._20_4_ = uVar97;
              auVar74._24_4_ = uVar97;
              auVar74._28_4_ = uVar97;
              auVar61 = vcvtdq2ps_avx(auVar61);
              uVar97 = *(undefined4 *)(uVar51 + 0x74 + lVar47);
              auVar76._4_4_ = uVar97;
              auVar76._0_4_ = uVar97;
              auVar76._8_4_ = uVar97;
              auVar76._12_4_ = uVar97;
              auVar76._16_4_ = uVar97;
              auVar76._20_4_ = uVar97;
              auVar76._24_4_ = uVar97;
              auVar76._28_4_ = uVar97;
              auVar57 = vfmadd213ps_fma(auVar61,auVar74,auVar76);
              auVar3._8_8_ = 0;
              auVar3._0_8_ = *(ulong *)(uVar51 + 0x98 + lVar47);
              auVar61 = vpmovzxbd_avx2(auVar3);
              auVar61 = vcvtdq2ps_avx(auVar61);
              uVar97 = *(undefined4 *)(uVar51 + 200 + lVar47);
              auVar80._4_4_ = uVar97;
              auVar80._0_4_ = uVar97;
              auVar80._8_4_ = uVar97;
              auVar80._12_4_ = uVar97;
              auVar80._16_4_ = uVar97;
              auVar80._20_4_ = uVar97;
              auVar80._24_4_ = uVar97;
              auVar80._28_4_ = uVar97;
              uVar97 = *(undefined4 *)(uVar51 + 0xbc + lVar47);
              auVar82._4_4_ = uVar97;
              auVar82._0_4_ = uVar97;
              auVar82._8_4_ = uVar97;
              auVar82._12_4_ = uVar97;
              auVar82._16_4_ = uVar97;
              auVar82._20_4_ = uVar97;
              auVar82._24_4_ = uVar97;
              auVar82._28_4_ = uVar97;
              auVar58 = vfmadd213ps_fma(auVar61,auVar80,auVar82);
              auVar61 = vsubps_avx(ZEXT1632(auVar58),ZEXT1632(auVar57));
              auVar57 = vfmadd213ps_fma(auVar61,auVar72,ZEXT1632(auVar57));
              auVar4._8_8_ = 0;
              auVar4._0_8_ = *(ulong *)(uVar51 + 0x58 + lVar47);
              auVar61 = vpmovzxbd_avx2(auVar4);
              auVar61 = vcvtdq2ps_avx(auVar61);
              auVar58 = vfmadd213ps_fma(auVar61,auVar74,auVar76);
              auVar5._8_8_ = 0;
              auVar5._0_8_ = *(ulong *)(uVar51 + 0xa0 + lVar47);
              auVar61 = vpmovzxbd_avx2(auVar5);
              auVar61 = vcvtdq2ps_avx(auVar61);
              auVar17 = vfmadd213ps_fma(auVar61,auVar80,auVar82);
              auVar61 = vsubps_avx(ZEXT1632(auVar17),ZEXT1632(auVar58));
              auVar58 = vfmadd213ps_fma(auVar61,auVar72,ZEXT1632(auVar58));
              auVar6._8_8_ = 0;
              auVar6._0_8_ = *(ulong *)(uVar51 + 0x60 + lVar47);
              auVar61 = vpmovzxbd_avx2(auVar6);
              uVar97 = *(undefined4 *)(uVar51 + 0x84 + lVar47);
              auVar77._4_4_ = uVar97;
              auVar77._0_4_ = uVar97;
              auVar77._8_4_ = uVar97;
              auVar77._12_4_ = uVar97;
              auVar77._16_4_ = uVar97;
              auVar77._20_4_ = uVar97;
              auVar77._24_4_ = uVar97;
              auVar77._28_4_ = uVar97;
              uVar97 = *(undefined4 *)(uVar51 + 0x78 + lVar47);
              auVar81._4_4_ = uVar97;
              auVar81._0_4_ = uVar97;
              auVar81._8_4_ = uVar97;
              auVar81._12_4_ = uVar97;
              auVar81._16_4_ = uVar97;
              auVar81._20_4_ = uVar97;
              auVar81._24_4_ = uVar97;
              auVar81._28_4_ = uVar97;
              auVar61 = vcvtdq2ps_avx(auVar61);
              auVar17 = vfmadd213ps_fma(auVar61,auVar77,auVar81);
              auVar7._8_8_ = 0;
              auVar7._0_8_ = *(ulong *)(uVar51 + 0xa8 + lVar47);
              auVar61 = vpmovzxbd_avx2(auVar7);
              uVar97 = *(undefined4 *)(uVar51 + 0xcc + lVar47);
              auVar83._4_4_ = uVar97;
              auVar83._0_4_ = uVar97;
              auVar83._8_4_ = uVar97;
              auVar83._12_4_ = uVar97;
              auVar83._16_4_ = uVar97;
              auVar83._20_4_ = uVar97;
              auVar83._24_4_ = uVar97;
              auVar83._28_4_ = uVar97;
              auVar61 = vcvtdq2ps_avx(auVar61);
              uVar97 = *(undefined4 *)(uVar51 + 0xc0 + lVar47);
              auVar110._4_4_ = uVar97;
              auVar110._0_4_ = uVar97;
              auVar110._8_4_ = uVar97;
              auVar110._12_4_ = uVar97;
              auVar110._16_4_ = uVar97;
              auVar110._20_4_ = uVar97;
              auVar110._24_4_ = uVar97;
              auVar110._28_4_ = uVar97;
              auVar55 = vfmadd213ps_fma(auVar61,auVar83,auVar110);
              auVar61 = vsubps_avx(ZEXT1632(auVar55),ZEXT1632(auVar17));
              auVar17 = vfmadd213ps_fma(auVar61,auVar72,ZEXT1632(auVar17));
              auVar8._8_8_ = 0;
              auVar8._0_8_ = *(ulong *)(uVar51 + 0x68 + lVar47);
              auVar61 = vpmovzxbd_avx2(auVar8);
              auVar61 = vcvtdq2ps_avx(auVar61);
              auVar55 = vfmadd213ps_fma(auVar61,auVar77,auVar81);
              auVar9._8_8_ = 0;
              auVar9._0_8_ = *(ulong *)(uVar51 + 0xb0 + lVar47);
              auVar61 = vpmovzxbd_avx2(auVar9);
              auVar61 = vcvtdq2ps_avx(auVar61);
              auVar59 = vfmadd213ps_fma(auVar61,auVar83,auVar110);
              auVar61 = vsubps_avx(ZEXT1632(auVar59),ZEXT1632(auVar55));
              auVar55 = vfmadd213ps_fma(auVar61,auVar72,ZEXT1632(auVar55));
              auVar61 = vsubps_avx512vl(ZEXT1632(auVar60),auVar125._0_32_);
              auVar61 = vmulps_avx512vl(auVar128._0_32_,auVar61);
              auVar62 = vsubps_avx512vl(ZEXT1632(auVar57),auVar126._0_32_);
              auVar63 = vmulps_avx512vl(auVar129._0_32_,auVar62);
              auVar62 = vsubps_avx512vl(ZEXT1632(auVar17),auVar127._0_32_);
              auVar68._4_4_ = auVar114._4_4_ * auVar62._4_4_;
              auVar68._0_4_ = auVar114._0_4_ * auVar62._0_4_;
              auVar68._8_4_ = auVar114._8_4_ * auVar62._8_4_;
              auVar68._12_4_ = auVar114._12_4_ * auVar62._12_4_;
              auVar68._16_4_ = auVar114._16_4_ * auVar62._16_4_;
              auVar68._20_4_ = auVar114._20_4_ * auVar62._20_4_;
              auVar68._24_4_ = auVar114._24_4_ * auVar62._24_4_;
              auVar68._28_4_ = auVar62._28_4_;
              auVar62 = vsubps_avx512vl(ZEXT1632(auVar56),auVar125._0_32_);
              auVar69._4_4_ = fVar116 * auVar62._4_4_;
              auVar69._0_4_ = fVar90 * auVar62._0_4_;
              auVar69._8_4_ = fVar54 * auVar62._8_4_;
              auVar69._12_4_ = fVar86 * auVar62._12_4_;
              auVar69._16_4_ = fVar87 * auVar62._16_4_;
              auVar69._20_4_ = fVar88 * auVar62._20_4_;
              auVar69._24_4_ = fVar89 * auVar62._24_4_;
              auVar69._28_4_ = auVar62._28_4_;
              auVar62 = vsubps_avx512vl(ZEXT1632(auVar58),auVar126._0_32_);
              auVar70._4_4_ = auVar118._4_4_ * auVar62._4_4_;
              auVar70._0_4_ = auVar118._0_4_ * auVar62._0_4_;
              auVar70._8_4_ = auVar118._8_4_ * auVar62._8_4_;
              auVar70._12_4_ = auVar118._12_4_ * auVar62._12_4_;
              auVar70._16_4_ = auVar118._16_4_ * auVar62._16_4_;
              auVar70._20_4_ = auVar118._20_4_ * auVar62._20_4_;
              auVar70._24_4_ = auVar118._24_4_ * auVar62._24_4_;
              auVar70._28_4_ = auVar62._28_4_;
              auVar62 = vsubps_avx512vl(ZEXT1632(auVar55),auVar127._0_32_);
              auVar71._4_4_ = auVar120._4_4_ * auVar62._4_4_;
              auVar71._0_4_ = auVar120._0_4_ * auVar62._0_4_;
              auVar71._8_4_ = auVar120._8_4_ * auVar62._8_4_;
              auVar71._12_4_ = auVar120._12_4_ * auVar62._12_4_;
              auVar71._16_4_ = auVar120._16_4_ * auVar62._16_4_;
              auVar71._20_4_ = auVar120._20_4_ * auVar62._20_4_;
              auVar71._24_4_ = auVar120._24_4_ * auVar62._24_4_;
              auVar71._28_4_ = auVar62._28_4_;
              auVar62 = vpminsd_avx2(auVar61,auVar69);
              auVar61 = vpmaxsd_avx2(auVar61,auVar69);
              auVar64 = vpminsd_avx2(auVar63,auVar70);
              auVar62 = vpmaxsd_avx2(auVar62,auVar64);
              auVar64 = vpmaxsd_avx2(auVar63,auVar70);
              auVar63 = vpminsd_avx2(auVar61,auVar64);
              auVar64 = vpminsd_avx2(auVar68,auVar71);
              auVar61 = vpmaxsd_avx2(auVar68,auVar71);
              auVar64 = vpmaxsd_avx2(auVar64,auVar122._0_32_);
              auVar62 = vpmaxsd_avx2(auVar62,auVar64);
              auVar61 = vpminsd_avx512vl(auVar61,auVar123._0_32_);
              auVar61 = vpminsd_avx2(auVar63,auVar61);
              uVar16 = vpcmpd_avx512vl(auVar62,auVar61,2);
              if ((byte)((byte)uVar16 & (byte)uVar14) != 0) {
                uVar33 = (ulong)(byte)((byte)uVar16 & (byte)uVar14);
                pSVar37 = local_1568->scene;
                local_1538 = lVar47 + uVar51;
                pRVar38 = ray;
                local_1560 = pSVar37;
                do {
                  ray = local_1520;
                  lVar49 = local_1528;
                  local_1518 = uVar33;
                  lVar40 = 0;
                  for (; (uVar33 & 1) == 0; uVar33 = uVar33 >> 1 | 0x8000000000000000) {
                    lVar40 = lVar40 + 1;
                  }
                  uVar10 = *(ushort *)(local_1538 + lVar40 * 8);
                  uVar11 = *(ushort *)(local_1538 + 2 + lVar40 * 8);
                  local_1548 = (ulong)*(uint *)(local_1538 + 0xd8);
                  local_1540 = (ulong)*(uint *)(local_1538 + 4 + lVar40 * 8);
                  pGVar36 = (pSVar37->geometries).items[local_1548].ptr;
                  lVar47 = *(long *)&pGVar36->field_0x58;
                  fVar116 = (pGVar36->time_range).lower;
                  fVar116 = pGVar36->fnumTimeSegments *
                            (((pRVar38->dir).field_0.m128[3] - fVar116) /
                            ((pGVar36->time_range).upper - fVar116));
                  auVar60 = vroundss_avx(ZEXT416((uint)fVar116),ZEXT416((uint)fVar116),9);
                  auVar60 = vminss_avx(auVar60,ZEXT416((uint)(pGVar36->fnumTimeSegments + -1.0)));
                  auVar59 = vmaxss_avx512f(auVar124._0_16_,auVar60);
                  local_1508 = pGVar36[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i * local_1540;
                  local_1550 = uVar10 & 0x7fff;
                  local_1554 = uVar11 & 0x7fff;
                  uVar12 = *(uint *)(lVar47 + 4 + local_1508);
                  uVar42 = (ulong)uVar12;
                  uVar35 = (ulong)(uVar12 * local_1554 + *(int *)(lVar47 + local_1508) + local_1550)
                  ;
                  lVar41 = *(long *)&pGVar36[2].numPrimitives;
                  lVar44 = (long)(int)auVar59._0_4_ * 0x38;
                  lVar43 = *(long *)(lVar41 + 0x10 + lVar44);
                  lVar45 = *(long *)(lVar41 + lVar44);
                  auVar60 = *(undefined1 (*) [16])(lVar45 + lVar43 * uVar35);
                  lVar46 = *(long *)(lVar41 + 0x48 + lVar44);
                  auVar56 = *(undefined1 (*) [16])(lVar45 + (uVar35 + 1) * lVar43);
                  lVar40 = uVar35 + uVar42;
                  auVar57 = *(undefined1 (*) [16])(lVar45 + lVar40 * lVar43);
                  lVar50 = uVar35 + uVar42 + 1;
                  auVar58 = *(undefined1 (*) [16])(lVar45 + lVar50 * lVar43);
                  uVar33 = (ulong)(-1 < (short)uVar10);
                  lVar34 = uVar35 + uVar33 + 1;
                  auVar17 = *(undefined1 (*) [16])(lVar45 + lVar34 * lVar43);
                  lVar39 = uVar33 + lVar50;
                  auVar55 = *(undefined1 (*) [16])(lVar45 + lVar39 * lVar43);
                  uVar33 = 0;
                  if (-1 < (short)uVar11) {
                    uVar33 = uVar42;
                  }
                  auVar101 = *(undefined1 (*) [16])(lVar45 + (lVar40 + uVar33) * lVar43);
                  auVar2 = *(undefined1 (*) [16])(lVar45 + (lVar50 + uVar33) * lVar43);
                  auVar3 = *(undefined1 (*) [16])(lVar45 + lVar43 * (uVar33 + lVar39));
                  lVar41 = *(long *)(lVar41 + 0x38 + lVar44);
                  fVar116 = fVar116 - auVar59._0_4_;
                  auVar92._4_4_ = fVar116;
                  auVar92._0_4_ = fVar116;
                  auVar92._8_4_ = fVar116;
                  auVar92._12_4_ = fVar116;
                  auVar59 = vsubps_avx(*(undefined1 (*) [16])(lVar41 + lVar46 * uVar35),auVar60);
                  auVar4 = vfmadd213ps_fma(auVar59,auVar92,auVar60);
                  auVar60 = vsubps_avx(*(undefined1 (*) [16])(lVar41 + lVar46 * (uVar35 + 1)),
                                       auVar56);
                  auVar5 = vfmadd213ps_fma(auVar60,auVar92,auVar56);
                  auVar60 = vsubps_avx(*(undefined1 (*) [16])(lVar41 + lVar46 * lVar40),auVar57);
                  auVar6 = vfmadd213ps_fma(auVar60,auVar92,auVar57);
                  auVar60 = vsubps_avx(*(undefined1 (*) [16])(lVar41 + lVar46 * lVar50),auVar58);
                  auVar7 = vfmadd213ps_fma(auVar60,auVar92,auVar58);
                  auVar60 = vsubps_avx(*(undefined1 (*) [16])(lVar41 + lVar46 * lVar34),auVar17);
                  auVar56 = vfmadd213ps_fma(auVar60,auVar92,auVar17);
                  auVar60 = vsubps_avx512vl(*(undefined1 (*) [16])(lVar41 + lVar46 * lVar39),auVar55
                                           );
                  auVar8 = vfmadd213ps_fma(auVar60,auVar92,auVar55);
                  auVar60 = vsubps_avx512vl(*(undefined1 (*) [16])
                                             (lVar41 + lVar46 * (lVar40 + uVar33)),auVar101);
                  auVar101 = vfmadd213ps_fma(auVar60,auVar92,auVar101);
                  auVar60 = vsubps_avx512vl(*(undefined1 (*) [16])
                                             (lVar41 + lVar46 * (lVar50 + uVar33)),auVar2);
                  auVar2 = vfmadd213ps_fma(auVar60,auVar92,auVar2);
                  auVar60 = vsubps_avx512vl(*(undefined1 (*) [16])
                                             (lVar41 + (uVar33 + lVar39) * lVar46),auVar3);
                  auVar3 = vfmadd213ps_fma(auVar60,auVar92,auVar3);
                  auVar57 = vunpcklps_avx(auVar5,auVar8);
                  auVar60 = vunpckhps_avx(auVar5,auVar8);
                  auVar58 = vunpcklps_avx(auVar56,auVar7);
                  auVar56 = vunpckhps_avx(auVar56,auVar7);
                  auVar17 = vunpcklps_avx(auVar60,auVar56);
                  auVar55 = vunpcklps_avx(auVar57,auVar58);
                  auVar60 = vunpckhps_avx(auVar57,auVar58);
                  auVar58 = vunpcklps_avx(auVar6,auVar2);
                  auVar56 = vunpckhps_avx(auVar6,auVar2);
                  auVar59 = vunpcklps_avx(auVar7,auVar101);
                  auVar57 = vunpckhps_avx(auVar7,auVar101);
                  auVar57 = vunpcklps_avx(auVar56,auVar57);
                  auVar101 = vunpcklps_avx(auVar58,auVar59);
                  auVar56 = vunpckhps_avx(auVar58,auVar59);
                  auVar102._16_16_ = auVar2;
                  auVar102._0_16_ = auVar6;
                  auVar99._16_16_ = auVar8;
                  auVar99._0_16_ = auVar5;
                  auVar61 = vunpcklps_avx(auVar99,auVar102);
                  auVar107._16_16_ = auVar3;
                  auVar107._0_16_ = auVar7;
                  auVar96._16_16_ = auVar7;
                  auVar96._0_16_ = auVar4;
                  auVar62 = vunpcklps_avx(auVar96,auVar107);
                  auVar63 = vunpcklps_avx(auVar62,auVar61);
                  auVar62 = vunpckhps_avx(auVar62,auVar61);
                  auVar61 = vunpckhps_avx(auVar99,auVar102);
                  auVar64 = vunpckhps_avx(auVar96,auVar107);
                  auVar64 = vunpcklps_avx(auVar64,auVar61);
                  auVar100._16_16_ = auVar55;
                  auVar100._0_16_ = auVar55;
                  auVar93._16_16_ = auVar60;
                  auVar93._0_16_ = auVar60;
                  auVar103._16_16_ = auVar17;
                  auVar103._0_16_ = auVar17;
                  auVar111._16_16_ = auVar101;
                  auVar111._0_16_ = auVar101;
                  auVar115._16_16_ = auVar56;
                  auVar115._0_16_ = auVar56;
                  auVar117._16_16_ = auVar57;
                  auVar117._0_16_ = auVar57;
                  uVar97 = *(undefined4 *)&(local_1520->org).field_0;
                  auVar119._4_4_ = uVar97;
                  auVar119._0_4_ = uVar97;
                  auVar119._8_4_ = uVar97;
                  auVar119._12_4_ = uVar97;
                  auVar119._16_4_ = uVar97;
                  auVar119._20_4_ = uVar97;
                  auVar119._24_4_ = uVar97;
                  auVar119._28_4_ = uVar97;
                  uVar97 = *(undefined4 *)((long)&(local_1520->org).field_0 + 4);
                  auVar121._4_4_ = uVar97;
                  auVar121._0_4_ = uVar97;
                  auVar121._8_4_ = uVar97;
                  auVar121._12_4_ = uVar97;
                  auVar121._16_4_ = uVar97;
                  auVar121._20_4_ = uVar97;
                  auVar121._24_4_ = uVar97;
                  auVar121._28_4_ = uVar97;
                  auVar65 = vbroadcastss_avx512vl(ZEXT416((uint)(local_1520->org).field_0.m128[2]));
                  uVar97 = *(undefined4 *)&(local_1520->dir).field_0;
                  auVar106._4_4_ = uVar97;
                  auVar106._0_4_ = uVar97;
                  auVar106._8_4_ = uVar97;
                  auVar106._12_4_ = uVar97;
                  auVar106._16_4_ = uVar97;
                  auVar106._20_4_ = uVar97;
                  auVar106._24_4_ = uVar97;
                  auVar106._28_4_ = uVar97;
                  uVar97 = *(undefined4 *)((long)&(local_1520->dir).field_0 + 4);
                  auVar108._4_4_ = uVar97;
                  auVar108._0_4_ = uVar97;
                  auVar108._8_4_ = uVar97;
                  auVar108._12_4_ = uVar97;
                  auVar108._16_4_ = uVar97;
                  auVar108._20_4_ = uVar97;
                  auVar108._24_4_ = uVar97;
                  auVar108._28_4_ = uVar97;
                  fVar116 = (local_1520->dir).field_0.m128[2];
                  auVar113._4_4_ = fVar116;
                  auVar113._0_4_ = fVar116;
                  auVar113._8_4_ = fVar116;
                  auVar113._12_4_ = fVar116;
                  auVar113._16_4_ = fVar116;
                  auVar113._20_4_ = fVar116;
                  auVar113._24_4_ = fVar116;
                  auVar113._28_4_ = fVar116;
                  auVar61 = vsubps_avx(auVar63,auVar119);
                  auVar62 = vsubps_avx(auVar62,auVar121);
                  auVar63 = vsubps_avx512vl(auVar64,auVar65);
                  auVar66 = vsubps_avx512vl(auVar100,auVar119);
                  auVar64 = vsubps_avx(auVar93,auVar121);
                  auVar67 = vsubps_avx512vl(auVar103,auVar65);
                  auVar68 = vsubps_avx512vl(auVar111,auVar119);
                  auVar69 = vsubps_avx512vl(auVar115,auVar121);
                  auVar65 = vsubps_avx512vl(auVar117,auVar65);
                  auVar70 = vsubps_avx512vl(auVar68,auVar61);
                  auVar71 = vsubps_avx512vl(auVar69,auVar62);
                  auVar72 = vsubps_avx512vl(auVar65,auVar63);
                  auVar73 = vsubps_avx512vl(auVar61,auVar66);
                  auVar74 = vsubps_avx512vl(auVar62,auVar64);
                  auVar75 = vsubps_avx512vl(auVar63,auVar67);
                  auVar76 = vsubps_avx512vl(auVar66,auVar68);
                  auVar77 = vsubps_avx512vl(auVar64,auVar69);
                  auVar78 = vsubps_avx512vl(auVar67,auVar65);
                  auVar79 = vaddps_avx512vl(auVar68,auVar61);
                  auVar80 = vaddps_avx512vl(auVar69,auVar62);
                  auVar81 = vaddps_avx512vl(auVar65,auVar63);
                  auVar82 = vmulps_avx512vl(auVar80,auVar72);
                  auVar82 = vfmsub231ps_avx512vl(auVar82,auVar71,auVar81);
                  auVar81 = vmulps_avx512vl(auVar81,auVar70);
                  auVar81 = vfmsub231ps_avx512vl(auVar81,auVar72,auVar79);
                  auVar25._4_4_ = auVar79._4_4_ * auVar71._4_4_;
                  auVar25._0_4_ = auVar79._0_4_ * auVar71._0_4_;
                  auVar25._8_4_ = auVar79._8_4_ * auVar71._8_4_;
                  auVar25._12_4_ = auVar79._12_4_ * auVar71._12_4_;
                  auVar25._16_4_ = auVar79._16_4_ * auVar71._16_4_;
                  auVar25._20_4_ = auVar79._20_4_ * auVar71._20_4_;
                  auVar25._24_4_ = auVar79._24_4_ * auVar71._24_4_;
                  auVar25._28_4_ = auVar79._28_4_;
                  auVar60 = vfmsub231ps_fma(auVar25,auVar70,auVar80);
                  auVar112._0_4_ = fVar116 * auVar60._0_4_;
                  auVar112._4_4_ = fVar116 * auVar60._4_4_;
                  auVar112._8_4_ = fVar116 * auVar60._8_4_;
                  auVar112._12_4_ = fVar116 * auVar60._12_4_;
                  auVar112._16_4_ = fVar116 * 0.0;
                  auVar112._20_4_ = fVar116 * 0.0;
                  auVar112._24_4_ = fVar116 * 0.0;
                  auVar112._28_4_ = 0;
                  auVar79 = vfmadd231ps_avx512vl(auVar112,auVar108,auVar81);
                  auVar79 = vfmadd231ps_avx512vl(auVar79,auVar106,auVar82);
                  auVar80 = vaddps_avx512vl(auVar61,auVar66);
                  auVar81 = vaddps_avx512vl(auVar62,auVar64);
                  auVar82 = vaddps_avx512vl(auVar63,auVar67);
                  auVar83 = vmulps_avx512vl(auVar81,auVar75);
                  auVar83 = vfmsub231ps_avx512vl(auVar83,auVar74,auVar82);
                  auVar82 = vmulps_avx512vl(auVar82,auVar73);
                  auVar82 = vfmsub231ps_avx512vl(auVar82,auVar75,auVar80);
                  auVar80 = vmulps_avx512vl(auVar80,auVar74);
                  auVar80 = vfmsub231ps_avx512vl(auVar80,auVar73,auVar81);
                  auVar26._4_4_ = fVar116 * auVar80._4_4_;
                  auVar26._0_4_ = fVar116 * auVar80._0_4_;
                  auVar26._8_4_ = fVar116 * auVar80._8_4_;
                  auVar26._12_4_ = fVar116 * auVar80._12_4_;
                  auVar26._16_4_ = fVar116 * auVar80._16_4_;
                  auVar26._20_4_ = fVar116 * auVar80._20_4_;
                  auVar26._24_4_ = fVar116 * auVar80._24_4_;
                  auVar26._28_4_ = auVar80._28_4_;
                  auVar80 = vfmadd231ps_avx512vl(auVar26,auVar108,auVar82);
                  auVar80 = vfmadd231ps_avx512vl(auVar80,auVar106,auVar83);
                  auVar81 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                  auVar66 = vaddps_avx512vl(auVar66,auVar68);
                  auVar64 = vaddps_avx512vl(auVar64,auVar69);
                  auVar65 = vaddps_avx512vl(auVar67,auVar65);
                  auVar67 = vmulps_avx512vl(auVar64,auVar78);
                  auVar67 = vfmsub231ps_avx512vl(auVar67,auVar77,auVar65);
                  auVar27._4_4_ = auVar65._4_4_ * auVar76._4_4_;
                  auVar27._0_4_ = auVar65._0_4_ * auVar76._0_4_;
                  auVar27._8_4_ = auVar65._8_4_ * auVar76._8_4_;
                  auVar27._12_4_ = auVar65._12_4_ * auVar76._12_4_;
                  auVar27._16_4_ = auVar65._16_4_ * auVar76._16_4_;
                  auVar27._20_4_ = auVar65._20_4_ * auVar76._20_4_;
                  auVar27._24_4_ = auVar65._24_4_ * auVar76._24_4_;
                  auVar27._28_4_ = auVar65._28_4_;
                  auVar65 = vfmsub231ps_avx512vl(auVar27,auVar78,auVar66);
                  auVar66 = vmulps_avx512vl(auVar66,auVar77);
                  auVar64 = vfmsub231ps_avx512vl(auVar66,auVar76,auVar64);
                  auVar64 = vmulps_avx512vl(auVar113,auVar64);
                  auVar64 = vfmadd231ps_avx512vl(auVar64,auVar108,auVar65);
                  auVar64 = vfmadd231ps_avx512vl(auVar64,auVar106,auVar67);
                  auVar94._0_4_ = auVar79._0_4_ + auVar80._0_4_;
                  auVar94._4_4_ = auVar79._4_4_ + auVar80._4_4_;
                  auVar94._8_4_ = auVar79._8_4_ + auVar80._8_4_;
                  auVar94._12_4_ = auVar79._12_4_ + auVar80._12_4_;
                  auVar94._16_4_ = auVar79._16_4_ + auVar80._16_4_;
                  auVar94._20_4_ = auVar79._20_4_ + auVar80._20_4_;
                  auVar94._24_4_ = auVar79._24_4_ + auVar80._24_4_;
                  auVar94._28_4_ = auVar79._28_4_ + auVar80._28_4_;
                  local_1300 = vaddps_avx512vl(auVar64,auVar94);
                  vandps_avx512vl(local_1300,auVar81);
                  auVar18._8_4_ = 0x34000000;
                  auVar18._0_8_ = 0x3400000034000000;
                  auVar18._12_4_ = 0x34000000;
                  auVar18._16_4_ = 0x34000000;
                  auVar18._20_4_ = 0x34000000;
                  auVar18._24_4_ = 0x34000000;
                  auVar18._28_4_ = 0x34000000;
                  auVar65 = vmulps_avx512vl(local_1300,auVar18);
                  auVar66 = vminps_avx512vl(auVar79,auVar80);
                  auVar66 = vminps_avx512vl(auVar66,auVar64);
                  auVar19._8_4_ = 0x80000000;
                  auVar19._0_8_ = 0x8000000080000000;
                  auVar19._12_4_ = 0x80000000;
                  auVar19._16_4_ = 0x80000000;
                  auVar19._20_4_ = 0x80000000;
                  auVar19._24_4_ = 0x80000000;
                  auVar19._28_4_ = 0x80000000;
                  auVar67 = vxorps_avx512vl(auVar65,auVar19);
                  uVar14 = vcmpps_avx512vl(auVar66,auVar67,5);
                  auVar66 = vmaxps_avx512vl(auVar79,auVar80);
                  auVar64 = vmaxps_avx512vl(auVar66,auVar64);
                  uVar16 = vcmpps_avx512vl(auVar64,auVar65,2);
                  local_12d8 = (byte)uVar14 | (byte)uVar16;
                  pSVar37 = local_1560;
                  lVar40 = local_1570;
                  lVar41 = local_1578;
                  lVar43 = local_1580;
                  lVar45 = local_1588;
                  lVar46 = local_1590;
                  if (local_12d8 != 0) {
                    auVar64 = vmulps_avx512vl(auVar72,auVar74);
                    auVar65 = vmulps_avx512vl(auVar70,auVar75);
                    auVar66 = vmulps_avx512vl(auVar71,auVar73);
                    auVar67 = vmulps_avx512vl(auVar75,auVar77);
                    auVar68 = vmulps_avx512vl(auVar73,auVar78);
                    auVar69 = vmulps_avx512vl(auVar74,auVar76);
                    auVar71 = vfmsub213ps_avx512vl(auVar71,auVar75,auVar64);
                    auVar72 = vfmsub213ps_avx512vl(auVar72,auVar73,auVar65);
                    auVar70 = vfmsub213ps_avx512vl(auVar70,auVar74,auVar66);
                    auVar78 = vfmsub213ps_avx512vl(auVar78,auVar74,auVar67);
                    auVar75 = vfmsub213ps_avx512vl(auVar76,auVar75,auVar68);
                    auVar73 = vfmsub213ps_avx512vl(auVar77,auVar73,auVar69);
                    vandps_avx512vl(auVar64,auVar81);
                    vandps_avx512vl(auVar67,auVar81);
                    uVar33 = vcmpps_avx512vl(auVar73,auVar73,1);
                    vandps_avx512vl(auVar65,auVar81);
                    vandps_avx512vl(auVar68,auVar81);
                    uVar35 = vcmpps_avx512vl(auVar73,auVar73,1);
                    vandps_avx512vl(auVar66,auVar81);
                    vandps_avx512vl(auVar69,auVar81);
                    uVar42 = vcmpps_avx512vl(auVar73,auVar73,1);
                    bVar13 = (bool)((byte)uVar33 & 1);
                    auVar84._0_4_ =
                         (float)((uint)bVar13 * auVar71._0_4_ | (uint)!bVar13 * auVar78._0_4_);
                    bVar13 = (bool)((byte)(uVar33 >> 1) & 1);
                    auVar84._4_4_ =
                         (float)((uint)bVar13 * auVar71._4_4_ | (uint)!bVar13 * auVar78._4_4_);
                    bVar13 = (bool)((byte)(uVar33 >> 2) & 1);
                    auVar84._8_4_ =
                         (float)((uint)bVar13 * auVar71._8_4_ | (uint)!bVar13 * auVar78._8_4_);
                    bVar13 = (bool)((byte)(uVar33 >> 3) & 1);
                    auVar84._12_4_ =
                         (float)((uint)bVar13 * auVar71._12_4_ | (uint)!bVar13 * auVar78._12_4_);
                    bVar13 = (bool)((byte)(uVar33 >> 4) & 1);
                    auVar84._16_4_ =
                         (float)((uint)bVar13 * auVar71._16_4_ | (uint)!bVar13 * auVar78._16_4_);
                    bVar13 = (bool)((byte)(uVar33 >> 5) & 1);
                    auVar84._20_4_ =
                         (float)((uint)bVar13 * auVar71._20_4_ | (uint)!bVar13 * auVar78._20_4_);
                    bVar13 = (bool)((byte)(uVar33 >> 6) & 1);
                    auVar84._24_4_ =
                         (float)((uint)bVar13 * auVar71._24_4_ | (uint)!bVar13 * auVar78._24_4_);
                    bVar13 = SUB81(uVar33 >> 7,0);
                    auVar84._28_4_ = (uint)bVar13 * auVar71._28_4_ | (uint)!bVar13 * auVar78._28_4_;
                    bVar13 = (bool)((byte)uVar35 & 1);
                    auVar85._0_4_ =
                         (float)((uint)bVar13 * auVar72._0_4_ | (uint)!bVar13 * auVar75._0_4_);
                    bVar13 = (bool)((byte)(uVar35 >> 1) & 1);
                    auVar85._4_4_ =
                         (float)((uint)bVar13 * auVar72._4_4_ | (uint)!bVar13 * auVar75._4_4_);
                    bVar13 = (bool)((byte)(uVar35 >> 2) & 1);
                    auVar85._8_4_ =
                         (float)((uint)bVar13 * auVar72._8_4_ | (uint)!bVar13 * auVar75._8_4_);
                    bVar13 = (bool)((byte)(uVar35 >> 3) & 1);
                    auVar85._12_4_ =
                         (float)((uint)bVar13 * auVar72._12_4_ | (uint)!bVar13 * auVar75._12_4_);
                    bVar13 = (bool)((byte)(uVar35 >> 4) & 1);
                    auVar85._16_4_ =
                         (float)((uint)bVar13 * auVar72._16_4_ | (uint)!bVar13 * auVar75._16_4_);
                    bVar13 = (bool)((byte)(uVar35 >> 5) & 1);
                    auVar85._20_4_ =
                         (float)((uint)bVar13 * auVar72._20_4_ | (uint)!bVar13 * auVar75._20_4_);
                    bVar13 = (bool)((byte)(uVar35 >> 6) & 1);
                    auVar85._24_4_ =
                         (float)((uint)bVar13 * auVar72._24_4_ | (uint)!bVar13 * auVar75._24_4_);
                    bVar13 = SUB81(uVar35 >> 7,0);
                    auVar85._28_4_ = (uint)bVar13 * auVar72._28_4_ | (uint)!bVar13 * auVar75._28_4_;
                    bVar13 = (bool)((byte)uVar42 & 1);
                    fVar54 = (float)((uint)bVar13 * auVar70._0_4_ | (uint)!bVar13 * auVar73._0_4_);
                    bVar13 = (bool)((byte)(uVar42 >> 1) & 1);
                    fVar86 = (float)((uint)bVar13 * auVar70._4_4_ | (uint)!bVar13 * auVar73._4_4_);
                    bVar13 = (bool)((byte)(uVar42 >> 2) & 1);
                    fVar87 = (float)((uint)bVar13 * auVar70._8_4_ | (uint)!bVar13 * auVar73._8_4_);
                    bVar13 = (bool)((byte)(uVar42 >> 3) & 1);
                    fVar88 = (float)((uint)bVar13 * auVar70._12_4_ | (uint)!bVar13 * auVar73._12_4_)
                    ;
                    bVar13 = (bool)((byte)(uVar42 >> 4) & 1);
                    fVar89 = (float)((uint)bVar13 * auVar70._16_4_ | (uint)!bVar13 * auVar73._16_4_)
                    ;
                    bVar13 = (bool)((byte)(uVar42 >> 5) & 1);
                    fVar90 = (float)((uint)bVar13 * auVar70._20_4_ | (uint)!bVar13 * auVar73._20_4_)
                    ;
                    bVar13 = (bool)((byte)(uVar42 >> 6) & 1);
                    fVar91 = (float)((uint)bVar13 * auVar70._24_4_ | (uint)!bVar13 * auVar73._24_4_)
                    ;
                    bVar13 = SUB81(uVar42 >> 7,0);
                    auVar28._4_4_ = fVar116 * fVar86;
                    auVar28._0_4_ = fVar116 * fVar54;
                    auVar28._8_4_ = fVar116 * fVar87;
                    auVar28._12_4_ = fVar116 * fVar88;
                    auVar28._16_4_ = fVar116 * fVar89;
                    auVar28._20_4_ = fVar116 * fVar90;
                    auVar28._24_4_ = fVar116 * fVar91;
                    auVar28._28_4_ = fVar116;
                    auVar60 = vfmadd213ps_fma(auVar108,auVar85,auVar28);
                    auVar60 = vfmadd213ps_fma(auVar106,auVar84,ZEXT1632(auVar60));
                    auVar64 = ZEXT1632(CONCAT412(auVar60._12_4_ + auVar60._12_4_,
                                                 CONCAT48(auVar60._8_4_ + auVar60._8_4_,
                                                          CONCAT44(auVar60._4_4_ + auVar60._4_4_,
                                                                   auVar60._0_4_ + auVar60._0_4_))))
                    ;
                    auVar109._0_4_ = auVar63._0_4_ * fVar54;
                    auVar109._4_4_ = auVar63._4_4_ * fVar86;
                    auVar109._8_4_ = auVar63._8_4_ * fVar87;
                    auVar109._12_4_ = auVar63._12_4_ * fVar88;
                    auVar109._16_4_ = auVar63._16_4_ * fVar89;
                    auVar109._20_4_ = auVar63._20_4_ * fVar90;
                    auVar109._24_4_ = auVar63._24_4_ * fVar91;
                    auVar109._28_4_ = 0;
                    auVar60 = vfmadd213ps_fma(auVar62,auVar85,auVar109);
                    auVar56 = vfmadd213ps_fma(auVar61,auVar84,ZEXT1632(auVar60));
                    auVar61 = vrcp14ps_avx512vl(auVar64);
                    auVar20._8_4_ = 0x3f800000;
                    auVar20._0_8_ = &DAT_3f8000003f800000;
                    auVar20._12_4_ = 0x3f800000;
                    auVar20._16_4_ = 0x3f800000;
                    auVar20._20_4_ = 0x3f800000;
                    auVar20._24_4_ = 0x3f800000;
                    auVar20._28_4_ = 0x3f800000;
                    auVar62 = vfnmadd213ps_avx512vl(auVar61,auVar64,auVar20);
                    auVar60 = vfmadd132ps_fma(auVar62,auVar61,auVar61);
                    local_1280 = ZEXT1632(CONCAT412(auVar60._12_4_ *
                                                    (auVar56._12_4_ + auVar56._12_4_),
                                                    CONCAT48(auVar60._8_4_ *
                                                             (auVar56._8_4_ + auVar56._8_4_),
                                                             CONCAT44(auVar60._4_4_ *
                                                                      (auVar56._4_4_ + auVar56._4_4_
                                                                      ),auVar60._0_4_ *
                                                                        (auVar56._0_4_ +
                                                                        auVar56._0_4_)))));
                    uVar97 = *(undefined4 *)((long)&(local_1520->org).field_0 + 0xc);
                    auVar21._4_4_ = uVar97;
                    auVar21._0_4_ = uVar97;
                    auVar21._8_4_ = uVar97;
                    auVar21._12_4_ = uVar97;
                    auVar21._16_4_ = uVar97;
                    auVar21._20_4_ = uVar97;
                    auVar21._24_4_ = uVar97;
                    auVar21._28_4_ = uVar97;
                    uVar14 = vcmpps_avx512vl(local_1280,auVar21,0xd);
                    auVar22._8_4_ = 0x80000000;
                    auVar22._0_8_ = 0x8000000080000000;
                    auVar22._12_4_ = 0x80000000;
                    auVar22._16_4_ = 0x80000000;
                    auVar22._20_4_ = 0x80000000;
                    auVar22._24_4_ = 0x80000000;
                    auVar22._28_4_ = 0x80000000;
                    auVar61 = vxorps_avx512vl(auVar64,auVar22);
                    fVar116 = local_1520->tfar;
                    auVar23._4_4_ = fVar116;
                    auVar23._0_4_ = fVar116;
                    auVar23._8_4_ = fVar116;
                    auVar23._12_4_ = fVar116;
                    auVar23._16_4_ = fVar116;
                    auVar23._20_4_ = fVar116;
                    auVar23._24_4_ = fVar116;
                    auVar23._28_4_ = fVar116;
                    uVar16 = vcmpps_avx512vl(local_1280,auVar23,2);
                    uVar15 = vcmpps_avx512vl(auVar64,auVar61,4);
                    local_12d8 = (byte)uVar14 & (byte)uVar16 & (byte)uVar15 & local_12d8;
                    if (local_12d8 != 0) {
                      local_12e0 = &local_15d1;
                      auVar61 = vsubps_avx(local_1300,auVar80);
                      auVar61 = vblendps_avx(auVar79,auVar61,0xf0);
                      auVar62 = vsubps_avx(local_1300,auVar79);
                      auVar62 = vblendps_avx(auVar80,auVar62,0xf0);
                      local_1260[0] = auVar84._0_4_ * 1.0;
                      local_1260[1] = auVar84._4_4_ * 1.0;
                      local_1260[2] = auVar84._8_4_ * 1.0;
                      local_1260[3] = auVar84._12_4_ * 1.0;
                      fStack_1250 = auVar84._16_4_ * -1.0;
                      fStack_124c = auVar84._20_4_ * -1.0;
                      fStack_1248 = auVar84._24_4_ * -1.0;
                      uStack_1244 = auVar84._28_4_;
                      local_1240[0] = auVar85._0_4_ * 1.0;
                      local_1240[1] = auVar85._4_4_ * 1.0;
                      local_1240[2] = auVar85._8_4_ * 1.0;
                      local_1240[3] = auVar85._12_4_ * 1.0;
                      fStack_1230 = auVar85._16_4_ * -1.0;
                      fStack_122c = auVar85._20_4_ * -1.0;
                      fStack_1228 = auVar85._24_4_ * -1.0;
                      uStack_1224 = auVar85._28_4_;
                      local_1220[0] = fVar54 * 1.0;
                      local_1220[1] = fVar86 * 1.0;
                      local_1220[2] = fVar87 * 1.0;
                      local_1220[3] = fVar88 * 1.0;
                      fStack_1210 = fVar89 * -1.0;
                      fStack_120c = fVar90 * -1.0;
                      fStack_1208 = fVar91 * -1.0;
                      uStack_1204 = (uint)bVar13 * auVar70._28_4_ | (uint)!bVar13 * auVar73._28_4_;
                      auVar64 = vpbroadcastd_avx512vl();
                      auVar64 = vpaddd_avx2(auVar64,_DAT_0205d4c0);
                      auVar65 = vpbroadcastd_avx512vl();
                      auVar65 = vpaddd_avx2(auVar65,_DAT_0205d4e0);
                      auVar104._0_4_ = (float)(int)(*(ushort *)(lVar47 + 8 + local_1508) - 1);
                      auVar104._4_12_ = auVar63._4_12_;
                      auVar31._12_4_ = 0;
                      auVar31._0_12_ = ZEXT812(0);
                      auVar56 = vrcp14ss_avx512f(auVar31 << 0x20,ZEXT416((uint)auVar104._0_4_));
                      auVar60 = vfnmadd213ss_fma(auVar104,auVar56,SUB6416(ZEXT464(0x40000000),0));
                      fStack_1328 = auVar56._0_4_ * auVar60._0_4_;
                      auVar60 = vcvtsi2ss_avx512f(auVar74._0_16_,
                                                  *(ushort *)(lVar47 + 10 + local_1508) - 1);
                      auVar56 = vrcp14ss_avx512f(auVar31 << 0x20,ZEXT416(auVar60._0_4_));
                      auVar60 = vfnmadd213ss_fma(auVar60,auVar56,SUB6416(ZEXT464(0x40000000),0));
                      fStack_1308 = auVar56._0_4_ * auVar60._0_4_;
                      auVar64 = vcvtdq2ps_avx(auVar64);
                      fStack_1324 = auVar64._28_4_ + auVar61._28_4_;
                      local_1340 = (local_1300._0_4_ * auVar64._0_4_ + auVar61._0_4_) * fStack_1328;
                      fStack_133c = (local_1300._4_4_ * auVar64._4_4_ + auVar61._4_4_) * fStack_1328
                      ;
                      fStack_1338 = (local_1300._8_4_ * auVar64._8_4_ + auVar61._8_4_) * fStack_1328
                      ;
                      fStack_1334 = (local_1300._12_4_ * auVar64._12_4_ + auVar61._12_4_) *
                                    fStack_1328;
                      fStack_1330 = (local_1300._16_4_ * auVar64._16_4_ + auVar61._16_4_) *
                                    fStack_1328;
                      fStack_132c = (local_1300._20_4_ * auVar64._20_4_ + auVar61._20_4_) *
                                    fStack_1328;
                      fStack_1328 = (local_1300._24_4_ * auVar64._24_4_ + auVar61._24_4_) *
                                    fStack_1328;
                      auVar61 = vcvtdq2ps_avx(auVar65);
                      local_1320 = (local_1300._0_4_ * auVar61._0_4_ + auVar62._0_4_) * fStack_1308;
                      fStack_131c = (local_1300._4_4_ * auVar61._4_4_ + auVar62._4_4_) * fStack_1308
                      ;
                      fStack_1318 = (local_1300._8_4_ * auVar61._8_4_ + auVar62._8_4_) * fStack_1308
                      ;
                      fStack_1314 = (local_1300._12_4_ * auVar61._12_4_ + auVar62._12_4_) *
                                    fStack_1308;
                      fStack_1310 = (local_1300._16_4_ * auVar61._16_4_ + auVar62._16_4_) *
                                    fStack_1308;
                      fStack_130c = (local_1300._20_4_ * auVar61._20_4_ + auVar62._20_4_) *
                                    fStack_1308;
                      fStack_1308 = (local_1300._24_4_ * auVar61._24_4_ + auVar62._24_4_) *
                                    fStack_1308;
                      fStack_1304 = auVar61._28_4_ + auVar62._28_4_;
                      pGVar36 = (local_1560->geometries).items[local_1548].ptr;
                      if ((pGVar36->mask & local_1520->mask) != 0) {
                        pRVar48 = local_1568->args;
                        if ((pRVar48->filter == (RTCFilterFunctionN)0x0) &&
                           (pGVar36->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_00730989:
                          auVar114 = ZEXT3264(local_1360);
                          auVar118 = ZEXT3264(local_13a0);
                          auVar120 = ZEXT3264(local_13c0);
                          auVar122 = ZEXT3264(local_13e0);
                          auVar123 = ZEXT3264(local_1400);
                          fVar90 = local_1380;
                          fVar116 = fStack_137c;
                          fVar54 = fStack_1378;
                          fVar86 = fStack_1374;
                          fVar87 = fStack_1370;
                          fVar88 = fStack_136c;
                          fVar89 = fStack_1368;
                          goto LAB_007309be;
                        }
                        auVar24._8_4_ = 0x219392ef;
                        auVar24._0_8_ = 0x219392ef219392ef;
                        auVar24._12_4_ = 0x219392ef;
                        auVar24._16_4_ = 0x219392ef;
                        auVar24._20_4_ = 0x219392ef;
                        auVar24._24_4_ = 0x219392ef;
                        auVar24._28_4_ = 0x219392ef;
                        uVar33 = vcmpps_avx512vl(local_1300,auVar24,5);
                        auVar61 = vrcp14ps_avx512vl(local_1300);
                        auVar105._8_4_ = 0x3f800000;
                        auVar105._0_8_ = &DAT_3f8000003f800000;
                        auVar105._12_4_ = 0x3f800000;
                        auVar105._16_4_ = 0x3f800000;
                        auVar105._20_4_ = 0x3f800000;
                        auVar105._24_4_ = 0x3f800000;
                        auVar105._28_4_ = 0x3f800000;
                        auVar60 = vfnmadd213ps_fma(local_1300,auVar61,auVar105);
                        auVar61 = vfmadd132ps_avx512vl(ZEXT1632(auVar60),auVar61,auVar61);
                        fVar90 = (float)((uint)((byte)uVar33 & 1) * auVar61._0_4_);
                        fVar89 = (float)((uint)((byte)(uVar33 >> 1) & 1) * auVar61._4_4_);
                        fVar88 = (float)((uint)((byte)(uVar33 >> 2) & 1) * auVar61._8_4_);
                        fVar87 = (float)((uint)((byte)(uVar33 >> 3) & 1) * auVar61._12_4_);
                        fVar86 = (float)((uint)((byte)(uVar33 >> 4) & 1) * auVar61._16_4_);
                        fVar54 = (float)((uint)((byte)(uVar33 >> 5) & 1) * auVar61._20_4_);
                        fVar116 = (float)((uint)((byte)(uVar33 >> 6) & 1) * auVar61._24_4_);
                        auVar29._4_4_ = fStack_133c * fVar89;
                        auVar29._0_4_ = local_1340 * fVar90;
                        auVar29._8_4_ = fStack_1338 * fVar88;
                        auVar29._12_4_ = fStack_1334 * fVar87;
                        auVar29._16_4_ = fStack_1330 * fVar86;
                        auVar29._20_4_ = fStack_132c * fVar54;
                        auVar29._24_4_ = fStack_1328 * fVar116;
                        auVar29._28_4_ = fStack_1324;
                        local_12c0 = vminps_avx(auVar29,auVar105);
                        auVar30._4_4_ = fStack_131c * fVar89;
                        auVar30._0_4_ = local_1320 * fVar90;
                        auVar30._8_4_ = fStack_1318 * fVar88;
                        auVar30._12_4_ = fStack_1314 * fVar87;
                        auVar30._16_4_ = fStack_1310 * fVar86;
                        auVar30._20_4_ = fStack_130c * fVar54;
                        auVar30._24_4_ = fStack_1308 * fVar116;
                        auVar30._28_4_ = (uint)(byte)(uVar33 >> 7) * auVar61._28_4_;
                        local_12a0 = vminps_avx(auVar30,auVar105);
                        local_15c0 = (ulong)local_12d8;
                        local_15a8._1_7_ = (undefined7)((ulong)lVar47 >> 8);
                        local_15a8 = CONCAT71(local_15a8._1_7_,local_15c0 == 0);
                        if (local_15c0 != 0) {
                          local_15b8 = 0;
                          for (uVar33 = local_15c0; (uVar33 & 1) == 0;
                              uVar33 = uVar33 >> 1 | 0x8000000000000000) {
                            local_15b8 = local_15b8 + 1;
                          }
                          local_15b0 = local_1568->user;
                          local_1420 = auVar125._0_32_;
                          local_1440 = auVar126._0_32_;
                          local_1460 = auVar127._0_32_;
                          local_1480 = auVar128._0_32_;
                          local_14a0 = auVar129._0_32_;
                          local_15a0 = pRVar48;
                          local_1598 = pGVar36;
                          do {
                            auVar60 = auVar124._0_16_;
                            local_14f4 = *(undefined4 *)(local_12c0 + local_15b8 * 4);
                            local_14f0 = *(undefined4 *)(local_12a0 + local_15b8 * 4);
                            local_15c4 = ray->tfar;
                            ray->tfar = local_1260[local_15b8 - 8];
                            local_1500 = local_1260[local_15b8];
                            local_14fc = local_1240[local_15b8];
                            local_14f8 = local_1220[local_15b8];
                            local_14ec = (int)local_1540;
                            local_14e8 = (int)local_1548;
                            local_14e4 = local_15b0->instID[0];
                            local_14e0 = local_15b0->instPrimID[0];
                            local_154c = -1;
                            local_14d0.valid = &local_154c;
                            local_14d0.geometryUserPtr = pGVar36->userPtr;
                            local_14d0.context = local_15b0;
                            local_14d0.ray = (RTCRayN *)ray;
                            local_14d0.hit = (RTCHitN *)&local_1500;
                            local_14d0.N = 1;
                            if (pGVar36->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00730851:
                              auVar60 = auVar124._0_16_;
                              if (pRVar48->filter != (RTCFilterFunctionN)0x0) {
                                if (((pRVar48->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                     RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                                   (((pGVar36->field_8).field_0x2 & 0x40) != 0)) {
                                  (*pRVar48->filter)(&local_14d0);
                                  auVar129 = ZEXT3264(local_14a0);
                                  auVar128 = ZEXT3264(local_1480);
                                  auVar127 = ZEXT3264(local_1460);
                                  auVar126 = ZEXT3264(local_1440);
                                  auVar125 = ZEXT3264(local_1420);
                                  auVar60 = vxorps_avx512vl(auVar60,auVar60);
                                  auVar124 = ZEXT1664(auVar60);
                                  pGVar36 = local_1598;
                                  pSVar37 = local_1560;
                                  lVar40 = local_1570;
                                  lVar41 = local_1578;
                                  lVar43 = local_1580;
                                  lVar45 = local_1588;
                                  lVar46 = local_1590;
                                  pRVar48 = local_15a0;
                                }
                                if (*local_14d0.valid == 0) goto LAB_007308dd;
                              }
                              if ((local_15a8 & 1) == 0) goto LAB_00730989;
                              break;
                            }
                            (*pGVar36->occlusionFilterN)(&local_14d0);
                            auVar129 = ZEXT3264(local_14a0);
                            auVar128 = ZEXT3264(local_1480);
                            auVar127 = ZEXT3264(local_1460);
                            auVar126 = ZEXT3264(local_1440);
                            auVar125 = ZEXT3264(local_1420);
                            auVar60 = vxorps_avx512vl(auVar60,auVar60);
                            auVar124 = ZEXT1664(auVar60);
                            pGVar36 = local_1598;
                            pSVar37 = local_1560;
                            lVar40 = local_1570;
                            lVar41 = local_1578;
                            lVar43 = local_1580;
                            lVar45 = local_1588;
                            lVar46 = local_1590;
                            pRVar48 = local_15a0;
                            if (*local_14d0.valid != 0) goto LAB_00730851;
LAB_007308dd:
                            ray->tfar = local_15c4;
                            uVar33 = local_15b8 & 0x3f;
                            local_15b8 = 0;
                            local_15c0 = local_15c0 ^ 1L << uVar33;
                            for (uVar33 = local_15c0; (uVar33 & 1) == 0;
                                uVar33 = uVar33 >> 1 | 0x8000000000000000) {
                              local_15b8 = local_15b8 + 1;
                            }
                            local_15a8 = CONCAT71(local_15a8._1_7_,local_15c0 == 0);
                          } while (local_15c0 != 0);
                        }
                      }
                    }
                  }
                  uVar33 = local_1518 - 1 & local_1518;
                  auVar114 = ZEXT3264(local_1360);
                  auVar118 = ZEXT3264(local_13a0);
                  auVar120 = ZEXT3264(local_13c0);
                  auVar122 = ZEXT3264(local_13e0);
                  auVar123 = ZEXT3264(local_1400);
                  pRVar38 = ray;
                  fVar90 = local_1380;
                  fVar116 = fStack_137c;
                  fVar54 = fStack_1378;
                  fVar86 = fStack_1374;
                  fVar87 = fStack_1370;
                  fVar88 = fStack_136c;
                  fVar89 = fStack_1368;
                } while (uVar33 != 0);
              }
              local_1510 = local_1510 + 1;
              bVar52 = local_1510 < local_1530;
            } while (local_1510 != local_1530);
          }
LAB_007309be:
          iVar32 = 0;
          if (bVar52) {
            ray->tfar = -INFINITY;
            iVar32 = 3;
          }
        }
      } while (iVar32 != 3);
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }